

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  float fVar4;
  int iVar5;
  ulong uVar6;
  undefined7 in_register_00000009;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  byte *pbVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  double dVar20;
  
  *pResult = 0.0;
  uVar8 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar8 == 1) {
    uVar13 = 1;
    lVar19 = 1;
    pbVar7 = (byte *)z;
  }
  else {
    uVar16 = 3 - uVar8;
    uVar13 = 1;
    if ((int)uVar16 < length) {
      lVar19 = (long)(int)(3 - uVar8);
      do {
        pcVar1 = z + lVar19;
        if (*pcVar1 != '\0') break;
        lVar19 = lVar19 + 2;
      } while (lVar19 < length);
      uVar16 = (uint)lVar19;
      uVar13 = (uint)(*pcVar1 == '\0');
    }
    length = uVar16 ^ 1;
    pbVar7 = (byte *)(z + (uVar8 & 1));
    lVar19 = 2;
  }
  pbVar11 = (byte *)(z + length);
  while( true ) {
    if (pbVar11 <= pbVar7) {
      return 0;
    }
    bVar2 = *pbVar7;
    if ((""[bVar2] & 1) == 0) break;
    pbVar7 = pbVar7 + lVar19;
  }
  iVar5 = 0;
  lVar12 = 0;
  if ((bVar2 - 0x2b & 0xfd) == 0) {
    lVar12 = lVar19;
  }
  pbVar7 = pbVar7 + lVar12;
  if (pbVar7 < pbVar11) {
    iVar14 = 0;
    lVar12 = 0;
    do {
      if ((9 < (ulong)*pbVar7 - 0x30) || (0xcccccccccccccca < lVar12)) break;
      lVar12 = (long)(char)*pbVar7 + lVar12 * 10 + -0x30;
      pbVar7 = pbVar7 + lVar19;
      iVar14 = iVar14 + 1;
    } while (pbVar7 < pbVar11);
  }
  else {
    lVar12 = 0;
    iVar14 = 0;
  }
  iVar15 = 1;
  if (pbVar7 < pbVar11) {
    iVar5 = 0;
LAB_0012d011:
    if (0xfffffffffffffff5 < (ulong)*pbVar7 - 0x3a) goto code_r0x0012d022;
    iVar14 = iVar14 + iVar5;
    if (*pbVar7 == 0x2e) {
      while ((pbVar7 = pbVar7 + lVar19, pbVar7 < pbVar11 &&
             (0xfffffffffffffff5 < (ulong)*pbVar7 - 0x3a))) {
        if (lVar12 < 0xccccccccccccccb) {
          lVar12 = (long)(char)*pbVar7 + lVar12 * 10 + -0x30;
          iVar5 = iVar5 + -1;
        }
        iVar14 = iVar14 + 1;
      }
    }
    if (pbVar11 <= pbVar7) goto LAB_0012d032;
    if ((*pbVar7 | 0x20) == 0x65) {
      pbVar7 = pbVar7 + lVar19;
      if (pbVar7 < pbVar11) {
        iVar15 = 1;
        if (*pbVar7 == 0x2b) {
          pbVar7 = pbVar7 + lVar19;
        }
        else if (*pbVar7 == 0x2d) {
          pbVar7 = pbVar7 + lVar19;
          iVar15 = -1;
        }
        iVar17 = 0;
        if ((pbVar7 < pbVar11) && (uVar6 = (ulong)*pbVar7, 0xfffffffffffffff5 < uVar6 - 0x3a)) {
          iVar18 = 0;
          do {
            pbVar7 = pbVar7 + lVar19;
            iVar17 = (char)uVar6 + -0x30 + iVar18 * 10;
            if (9999 < iVar18) {
              iVar17 = 10000;
            }
          } while ((pbVar7 < pbVar11) &&
                  (uVar6 = (ulong)*pbVar7, iVar18 = iVar17, 0xfffffffffffffff5 < uVar6 - 0x3a));
          bVar10 = true;
        }
        else {
          bVar10 = false;
        }
        goto LAB_0012d3bc;
      }
      iVar17 = 0;
      iVar15 = 1;
      bVar10 = false;
    }
    else {
      iVar17 = 0;
      iVar15 = 1;
      bVar10 = true;
LAB_0012d3bc:
      while ((pbVar7 < pbVar11 && ((""[*pbVar7] & 1) != 0))) {
        pbVar7 = pbVar7 + lVar19;
      }
    }
    goto LAB_0012d037;
  }
LAB_0012d032:
  iVar17 = 0;
  bVar10 = true;
LAB_0012d037:
  if (lVar12 == 0) {
    if (bVar2 == 0x2d) {
      dVar20 = -0.0;
    }
    else {
      dVar20 = 0.0;
    }
  }
  else {
    uVar16 = iVar17 * iVar15 + iVar5;
    uVar8 = -uVar16;
    if (0 < (int)uVar16) {
      uVar8 = uVar16;
    }
    uVar9 = uVar8;
    if (uVar16 != 0) {
      do {
        if ((int)uVar16 < 0) {
          uVar6 = lVar12 * -0x3333333333333333 + 0x1999999999999998;
          if (0x1999999999999998 < (uVar6 >> 1 | (ulong)((uVar6 & 1) != 0) << 0x3f))
          goto LAB_0012d1a4;
          lVar12 = lVar12 / 10;
        }
        else {
          if (0xccccccccccccccb < lVar12) {
LAB_0012d1a4:
            lVar19 = -lVar12;
            uVar8 = uVar9;
            if (bVar2 != 0x2d) {
              lVar19 = lVar12;
            }
            goto LAB_0012d1b2;
          }
          lVar12 = lVar12 * 10;
        }
        uVar8 = uVar9 - 1;
        bVar3 = 1 < (int)uVar9;
        uVar9 = uVar8;
      } while (bVar3);
    }
    lVar19 = -lVar12;
    if (bVar2 != 0x2d) {
      lVar19 = lVar12;
    }
    if (uVar8 == 0) {
      dVar20 = (double)lVar19;
    }
    else {
LAB_0012d1b2:
      if ((int)uVar8 < 0x134) {
        uVar9 = uVar8 * -0x45d1745d + 0xba2e8ba;
        fVar4 = 1.0;
        if (0xba2e8ba < (uVar9 >> 1 | (uint)((uVar9 & 1) != 0) << 0x1f)) {
          fVar4 = 1.0;
          do {
            fVar4 = fVar4 * 10.0;
            iVar5 = uVar8 * -0x45d1745d;
            uVar8 = uVar8 - 1;
            uVar9 = iVar5 + 0x51745d17;
          } while (0xba2e8ba < (uVar9 >> 1 | (uint)((uVar9 & 1) != 0) << 0x1f));
        }
        if (0 < (int)uVar8) {
          uVar8 = uVar8 + 0x16;
          do {
            fVar4 = fVar4 * 1e+22;
            uVar8 = uVar8 - 0x16;
          } while (0x16 < uVar8);
        }
        if ((int)uVar16 < 0) {
          dVar20 = (double)((float)lVar19 / fVar4);
        }
        else {
          dVar20 = (double)((float)lVar19 * fVar4);
        }
      }
      else if (uVar8 < 0x156) {
        fVar4 = 1.0;
        if (uVar8 != 0x134) {
          fVar4 = 1.0;
          do {
            uVar8 = uVar8 - 1;
            fVar4 = fVar4 * 10.0;
          } while (0xd4c77a < (uVar8 * 0x3f2b3885 + 0x1a98ef4 >> 2 | uVar8 * 0x40000000));
        }
        if ((int)uVar16 < 0) {
          dVar20 = (double)((float)lVar19 / fVar4) / 1e+308;
        }
        else {
          dVar20 = (double)((float)lVar19 * fVar4) * 1e+308;
        }
      }
      else if ((int)uVar16 < 0) {
        dVar20 = (double)((ulong)(double)lVar19 & 0x8000000000000000);
      }
      else {
        dVar20 = (double)lVar19 * INFINITY;
      }
    }
  }
  if (iVar14 < 1) {
    uVar13 = 0;
  }
  *pResult = dVar20;
  if (pbVar7 != pbVar11) {
    uVar13 = 0;
  }
  if (!bVar10) {
    uVar13 = 0;
  }
  return uVar13;
code_r0x0012d022:
  pbVar7 = pbVar7 + lVar19;
  iVar5 = iVar5 + 1;
  if (pbVar11 <= pbVar7) goto code_r0x0012d02c;
  goto LAB_0012d011;
code_r0x0012d02c:
  iVar14 = iVar14 + iVar5;
  goto LAB_0012d032;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr, nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ) z+=incr, nDigits++, d++;
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
      }
      z+=incr, nDigits++;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;

    /* This branch is needed to avoid a (harmless) buffer overread.  The 
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      LONGDOUBLE_TYPE scale = 1.0;
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          while( e%308 ) { scale *= 1.0e+1; e -= 1; }
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
            result = 1e308*1e308*s;  /* Infinity */
          }
        }
      }else{
        /* 1.0e+22 is the largest power of 10 than can be 
        ** represented exactly. */
        while( e%22 ) { scale *= 1.0e+1; e -= 1; }
        while( e>0 ) { scale *= 1.0e+22; e -= 22; }
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z==zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}